

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmTruth.c
# Opt level: O3

int Mpm_CutComputeTruth(Mpm_Man_t *p,Mpm_Cut_t *pCut,Mpm_Cut_t *pCut0,Mpm_Cut_t *pCut1,
                       Mpm_Cut_t *pCutC,int fCompl0,int fCompl1,int fComplC,int Type)

{
  ulong *puVar1;
  Vec_Mem_t *pVVar2;
  uint uVar3;
  int v;
  int iVar4;
  long lVar5;
  byte bVar6;
  uint uVar7;
  ulong *puVar8;
  word *pwVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  ulong *puVar16;
  ulong uVar17;
  word *pwVar18;
  uint uVar19;
  ulong uVar20;
  word *pwVar21;
  ulong uVar22;
  ulong uVar23;
  uint uVar24;
  word t1;
  word t0;
  word tC;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  word local_40;
  ulong local_38;
  
  iVar4 = p->nLutSize;
  uVar24 = *(uint *)&pCut0->field_0x4;
  uVar10 = uVar24 >> 1 & 0xffffff;
  pVVar2 = p->vTtMem;
  uVar7 = pVVar2->nEntries;
  if (6 < iVar4) {
    if ((int)uVar7 <= (int)uVar10) goto LAB_003f9084;
    bVar6 = (byte)pVVar2->LogPageSze;
    uVar19 = *(uint *)&pCut1->field_0x4 >> 1 & 0xffffff;
    if (uVar7 <= uVar19) goto LAB_003f9084;
    iVar11 = (uVar10 & pVVar2->PageMask) * pVVar2->nEntrySize;
    pwVar9 = pVVar2->ppPages[uVar10 >> (bVar6 & 0x1f)];
    iVar13 = (uVar19 & pVVar2->PageMask) * pVVar2->nEntrySize;
    pwVar21 = pVVar2->ppPages[uVar19 >> (bVar6 & 0x1f)];
    pwVar18 = p->Truth0;
    uVar7 = p->nTruWords;
    uVar23 = (ulong)uVar7;
    if ((uVar24 >> 0x19 & 1 ^ fCompl0) == (uVar24 & 1)) {
      if (0 < (int)uVar7) {
        uVar17 = 0;
        do {
          pwVar18[uVar17] = pwVar9[(long)iVar11 + uVar17];
          uVar17 = uVar17 + 1;
        } while (uVar23 != uVar17);
      }
    }
    else if (0 < (int)uVar7) {
      uVar17 = 0;
      do {
        pwVar18[uVar17] = ~pwVar9[(long)iVar11 + uVar17];
        uVar17 = uVar17 + 1;
      } while (uVar23 != uVar17);
    }
    pwVar9 = p->Truth1;
    if ((*(uint *)&pCut1->field_0x4 >> 0x19 & 1 ^ fCompl1) == (*(uint *)&pCut1->field_0x4 & 1)) {
      if (0 < (int)uVar7) {
        uVar17 = 0;
        do {
          pwVar9[uVar17] = pwVar21[(long)iVar13 + uVar17];
          uVar17 = uVar17 + 1;
        } while (uVar23 != uVar17);
      }
    }
    else if (0 < (int)uVar7) {
      uVar17 = 0;
      do {
        pwVar9[uVar17] = ~pwVar21[(long)iVar13 + uVar17];
        uVar17 = uVar17 + 1;
      } while (uVar23 != uVar17);
    }
    uVar24 = *(uint *)&pCut->field_0x4;
    if (0x7ffffff < *(uint *)&pCut0->field_0x4 && 0x7ffffff < uVar24) {
      uVar7 = (*(uint *)&pCut0->field_0x4 >> 0x1b) - 1;
      uVar23 = (ulong)(uVar24 >> 0x1b);
      do {
        if (pCut->pLeaves[uVar23 - 1] <= pCut0->pLeaves[uVar7]) {
          if (pCut0->pLeaves[uVar7] != pCut->pLeaves[uVar23 - 1]) goto LAB_003f9065;
          uVar24 = (int)uVar23 - 1;
          if (uVar7 < uVar24) {
            Abc_TtSwapVars(pwVar18,iVar4,uVar7,uVar24);
          }
          uVar7 = uVar7 - 1;
        }
      } while ((1 < uVar23) && (uVar23 = uVar23 - 1, -1 < (int)uVar7));
      iVar4 = p->nLutSize;
      uVar24 = *(uint *)&pCut->field_0x4;
    }
    if (0x7ffffff < *(uint *)&pCut1->field_0x4 && 0x7ffffff < uVar24) {
      uVar7 = (*(uint *)&pCut1->field_0x4 >> 0x1b) - 1;
      uVar23 = (ulong)(uVar24 >> 0x1b);
      do {
        if (pCut->pLeaves[uVar23 - 1] <= pCut1->pLeaves[uVar7]) {
          if (pCut1->pLeaves[uVar7] != pCut->pLeaves[uVar23 - 1]) goto LAB_003f9065;
          uVar24 = (int)uVar23 - 1;
          if (uVar7 < uVar24) {
            Abc_TtSwapVars(pwVar9,iVar4,uVar7,uVar24);
          }
          uVar7 = uVar7 - 1;
        }
      } while ((1 < uVar23) && (uVar23 = uVar23 - 1, -1 < (int)uVar7));
    }
    if (pCutC != (Mpm_Cut_t *)0x0) {
      uVar24 = *(uint *)&pCutC->field_0x4;
      uVar7 = uVar24 >> 1 & 0xffffff;
      pVVar2 = p->vTtMem;
      if (pVVar2->nEntries <= (int)uVar7) goto LAB_003f9084;
      iVar4 = (uVar7 & pVVar2->PageMask) * pVVar2->nEntrySize;
      pwVar9 = pVVar2->ppPages[uVar7 >> ((byte)pVVar2->LogPageSze & 0x1f)];
      pwVar18 = p->TruthC;
      uVar7 = p->nTruWords;
      if ((uVar24 >> 0x19 & 1 ^ fComplC) == (uVar24 & 1)) {
        if (0 < (int)uVar7) {
          uVar23 = 0;
          do {
            pwVar18[uVar23] = pwVar9[(long)iVar4 + uVar23];
            uVar23 = uVar23 + 1;
          } while (uVar7 != uVar23);
        }
      }
      else if (0 < (int)uVar7) {
        uVar23 = 0;
        do {
          pwVar18[uVar23] = ~pwVar9[(long)iVar4 + uVar23];
          uVar23 = uVar23 + 1;
        } while (uVar7 != uVar23);
      }
      if (0x7ffffff < *(uint *)&pCutC->field_0x4 && 0x7ffffff < *(uint *)&pCut->field_0x4) {
        iVar4 = p->nLutSize;
        uVar24 = (*(uint *)&pCutC->field_0x4 >> 0x1b) - 1;
        uVar23 = (ulong)(*(uint *)&pCut->field_0x4 >> 0x1b);
        do {
          if (pCut->pLeaves[uVar23 - 1] <= pCutC->pLeaves[uVar24]) {
            if (pCutC->pLeaves[uVar24] != pCut->pLeaves[uVar23 - 1]) goto LAB_003f9065;
            uVar7 = (int)uVar23 - 1;
            if (uVar24 < uVar7) {
              Abc_TtSwapVars(pwVar18,iVar4,uVar24,uVar7);
            }
            uVar24 = uVar24 - 1;
          }
        } while ((1 < uVar23) && (uVar23 = uVar23 - 1, -1 < (int)uVar24));
      }
    }
    if (Type == 3) {
      uVar24 = p->nTruWords;
      if (0 < (long)(int)uVar24) {
        lVar5 = 0;
        do {
          p->Truth[lVar5] =
               (p->Truth1[lVar5] ^ p->Truth0[lVar5]) & p->TruthC[lVar5] ^ p->Truth0[lVar5];
          lVar5 = lVar5 + 1;
        } while ((int)uVar24 != lVar5);
      }
    }
    else if (Type == 2) {
      uVar24 = p->nTruWords;
      if (0 < (long)(int)uVar24) {
        lVar5 = 0;
        do {
          p->Truth[lVar5] = p->Truth1[lVar5] ^ p->Truth0[lVar5];
          lVar5 = lVar5 + 1;
        } while ((int)uVar24 != lVar5);
      }
    }
    else {
      if (Type != 1) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mpm/mpmTruth.c"
                      ,0xca,
                      "int Mpm_CutComputeTruth7(Mpm_Man_t *, Mpm_Cut_t *, Mpm_Cut_t *, Mpm_Cut_t *, Mpm_Cut_t *, int, int, int, int)"
                     );
      }
      uVar24 = p->nTruWords;
      if (0 < (long)(int)uVar24) {
        lVar5 = 0;
        do {
          p->Truth[lVar5] = p->Truth1[lVar5] & p->Truth0[lVar5];
          lVar5 = lVar5 + 1;
        } while ((int)uVar24 != lVar5);
      }
    }
    pwVar18 = p->Truth;
    if ((p->Truth[0] & 1) == 0) {
      uVar24 = Vec_MemHashInsert(p->vTtMem,pwVar18);
      if ((int)uVar24 < 0) goto LAB_003f90a3;
      uVar24 = (*(uint *)&pCut->field_0x4 & 0xfe000000) + (uVar24 & 0xffffff) * 2;
    }
    else {
      if (0 < (int)uVar24) {
        uVar23 = 0;
        do {
          pwVar18[uVar23] = ~pwVar18[uVar23];
          uVar23 = uVar23 + 1;
        } while (uVar24 != uVar23);
      }
      uVar24 = Vec_MemHashInsert(p->vTtMem,pwVar18);
      if ((int)uVar24 < 0) goto LAB_003f90a3;
      uVar24 = (*(uint *)&pCut->field_0x4 & 0xfe000000) + (uVar24 & 0xffffff) * 2 + 1;
    }
    *(uint *)&pCut->field_0x4 = uVar24;
    if (p->pPars->fCutMin == 0) {
      return 1;
    }
    uVar7 = uVar24 >> 1 & 0xffffff;
    pVVar2 = p->vTtMem;
    if (pVVar2->nEntries <= (int)uVar7) goto LAB_003f9084;
    puVar1 = pVVar2->ppPages[uVar7 >> ((byte)pVVar2->LogPageSze & 0x1f)] +
             (int)((uVar7 & pVVar2->PageMask) * pVVar2->nEntrySize);
    uVar10 = 0;
    uVar7 = 0;
    if (0x7ffffff < uVar24) {
      uVar17 = (ulong)(uint)(1 << ((byte)(uVar24 >> 0x1b) - 6 & 0x1f));
      uVar10 = 0;
      uVar23 = 0;
      uVar7 = 0;
      do {
        bVar6 = (byte)uVar23;
        if (uVar24 < 0x38000000) {
          uVar19 = 1 << (bVar6 & 0x1f);
          if ((s_Truths6Neg[uVar23] & (*puVar1 >> ((byte)uVar19 & 0x3f) ^ *puVar1)) != 0) {
LAB_003f8e7e:
            uVar7 = uVar19 | uVar7;
            uVar10 = uVar10 + 1;
          }
        }
        else if (uVar23 < 6) {
          uVar19 = 1 << (bVar6 & 0x1f);
          uVar12 = 0;
          do {
            if (((puVar1[uVar12] >> ((byte)uVar19 & 0x3f) ^ puVar1[uVar12]) & s_Truths6Neg[uVar23])
                != 0) goto LAB_003f8e7e;
            uVar12 = uVar12 + 1;
          } while (uVar17 != uVar12);
        }
        else {
          uVar12 = (ulong)(uint)(1 << (bVar6 - 6 & 0x1f));
          uVar19 = 2 << (bVar6 - 6 & 0x1f);
          puVar8 = puVar1 + uVar12;
          puVar16 = puVar1;
          do {
            uVar20 = 0;
            do {
              if (puVar16[uVar20] != puVar8[uVar20]) {
                uVar19 = 1 << (bVar6 & 0x1f);
                goto LAB_003f8e7e;
              }
              uVar20 = uVar20 + 1;
            } while (uVar12 != uVar20);
            puVar16 = puVar16 + uVar19;
            puVar8 = puVar8 + uVar19;
          } while (puVar16 < puVar1 + uVar17);
        }
        uVar23 = uVar23 + 1;
      } while (uVar23 != uVar24 >> 0x1b);
    }
    if (uVar10 == uVar24 >> 0x1b) {
      return 0;
    }
    p->nSmallSupp = p->nSmallSupp + (uint)((int)uVar10 < 2);
    iVar4 = p->nTruWords;
    if (0 < (long)iVar4) {
      lVar5 = 0;
      do {
        pwVar18[lVar5] = puVar1[lVar5];
        lVar5 = lVar5 + 1;
      } while (iVar4 != lVar5);
    }
    uVar24 = *(uint *)&pCut->field_0x4;
    if (uVar24 < 0x8000000) {
      uVar17 = (ulong)(uVar24 >> 0x1b);
      uVar19 = 0;
    }
    else {
      uVar23 = 0;
      uVar19 = 0;
      do {
        if ((uVar7 >> ((uint)uVar23 & 0x1f) & 1) != 0) {
          if ((long)(int)uVar19 < (long)uVar23) {
            pCut->pLeaves[(int)uVar19] = pCut->pLeaves[uVar23];
            Abc_TtSwapVars(pwVar18,p->nLutSize,uVar19,(uint)uVar23);
            uVar24 = *(uint *)&pCut->field_0x4;
          }
          uVar19 = uVar19 + 1;
        }
        uVar23 = uVar23 + 1;
        uVar17 = (ulong)(uVar24 >> 0x1b);
      } while (uVar23 < uVar17);
    }
    if (uVar19 != uVar10) {
      __assert_fail("k == nSuppSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mpm/mpmTruth.c"
                    ,0x7e,"int Mpm_CutTruthMinimize7(Mpm_Man_t *, Mpm_Cut_t *)");
    }
    uVar7 = 0;
    if (0x7ffffff < uVar24) {
      uVar12 = (ulong)(uint)(1 << ((char)uVar17 - 6U & 0x1f));
      uVar23 = 0;
      uVar7 = 0;
      do {
        bVar6 = (byte)uVar23;
        if (uVar24 < 0x38000000) {
          if ((s_Truths6Neg[uVar23] & (*pwVar18 >> ((byte)(1 << (bVar6 & 0x1f)) & 0x3f) ^ *pwVar18))
              != 0) {
LAB_003f8fe3:
            uVar7 = uVar7 + 1;
          }
        }
        else if (uVar23 < 6) {
          uVar20 = 0;
          do {
            if (((pwVar18[uVar20] >> ((byte)(1 << (bVar6 & 0x1f)) & 0x3f) ^ pwVar18[uVar20]) &
                s_Truths6Neg[uVar23]) != 0) goto LAB_003f8fe3;
            uVar20 = uVar20 + 1;
          } while (uVar12 != uVar20);
        }
        else {
          uVar20 = (ulong)(uint)(1 << (bVar6 - 6 & 0x1f));
          uVar19 = 2 << (bVar6 - 6 & 0x1f);
          pwVar9 = pwVar18 + uVar20;
          pwVar21 = pwVar18;
          do {
            uVar22 = 0;
            do {
              if (pwVar21[uVar22] != pwVar9[uVar22]) goto LAB_003f8fe3;
              uVar22 = uVar22 + 1;
            } while (uVar20 != uVar22);
            pwVar21 = pwVar21 + uVar19;
            pwVar9 = pwVar9 + uVar19;
          } while (pwVar21 < pwVar18 + uVar12);
        }
        uVar23 = uVar23 + 1;
      } while (uVar23 != uVar17);
    }
    if (uVar10 != uVar7) {
      __assert_fail("nSuppSize == Abc_TtSupportSize(p->Truth, Mpm_CutLeafNum(pCut))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mpm/mpmTruth.c"
                    ,0x7f,"int Mpm_CutTruthMinimize7(Mpm_Man_t *, Mpm_Cut_t *)");
    }
    *(uint *)&pCut->field_0x4 = uVar24 & 0x7ffffff | uVar10 << 0x1b;
    uVar24 = Vec_MemHashInsert(p->vTtMem,pwVar18);
    if (-1 < (int)uVar24) {
      *(uint *)&pCut->field_0x4 = (*(uint *)&pCut->field_0x4 & 0xfe000001) + (uVar24 & 0xffffff) * 2
      ;
      return 1;
    }
    goto LAB_003f90a3;
  }
  if ((int)uVar7 <= (int)uVar10) goto LAB_003f9084;
  uVar19 = *(uint *)&pCut1->field_0x4;
  uVar15 = uVar19 >> 1 & 0xffffff;
  if (uVar7 <= uVar15) goto LAB_003f9084;
  bVar6 = (byte)pVVar2->LogPageSze;
  local_48 = -(ulong)((uVar24 >> 0x19 & 1 ^ fCompl0) != (uVar24 & 1)) ^
             pVVar2->ppPages[uVar10 >> (bVar6 & 0x1f)]
             [(int)((uVar10 & pVVar2->PageMask) * pVVar2->nEntrySize)];
  local_50 = -(ulong)((uVar19 >> 0x19 & 1 ^ fCompl1) != (uVar19 & 1)) ^
             pVVar2->ppPages[uVar15 >> (bVar6 & 0x1f)]
             [(int)((pVVar2->PageMask & uVar15) * pVVar2->nEntrySize)];
  local_40 = 0;
  uVar7 = *(uint *)&pCut->field_0x4;
  if (0x7ffffff < uVar24 && 0x7ffffff < uVar7) {
    uVar24 = (uVar24 >> 0x1b) - 1;
    uVar23 = (ulong)(uVar7 >> 0x1b);
    do {
      if (pCut->pLeaves[uVar23 - 1] <= pCut0->pLeaves[uVar24]) {
        if (pCut0->pLeaves[uVar24] != pCut->pLeaves[uVar23 - 1]) goto LAB_003f9065;
        uVar7 = (int)uVar23 - 1;
        if (uVar24 < uVar7) {
          Abc_TtSwapVars(&local_48,iVar4,uVar24,uVar7);
        }
        uVar24 = uVar24 - 1;
      }
    } while ((1 < uVar23) && (uVar23 = uVar23 - 1, -1 < (int)uVar24));
    iVar4 = p->nLutSize;
    uVar7 = *(uint *)&pCut->field_0x4;
    uVar19 = *(uint *)&pCut1->field_0x4;
  }
  if (0x7ffffff < uVar19 && 0x7ffffff < uVar7) {
    uVar24 = (uVar19 >> 0x1b) - 1;
    uVar23 = (ulong)(uVar7 >> 0x1b);
    do {
      if (pCut->pLeaves[uVar23 - 1] <= pCut1->pLeaves[uVar24]) {
        if (pCut1->pLeaves[uVar24] != pCut->pLeaves[uVar23 - 1]) goto LAB_003f9065;
        uVar7 = (int)uVar23 - 1;
        if (uVar24 < uVar7) {
          Abc_TtSwapVars(&local_50,iVar4,uVar24,uVar7);
        }
        uVar24 = uVar24 - 1;
      }
    } while ((1 < uVar23) && (uVar23 = uVar23 - 1, -1 < (int)uVar24));
  }
  if (pCutC == (Mpm_Cut_t *)0x0) {
LAB_003f865f:
    iVar4 = p->nLutSize;
  }
  else {
    uVar24 = *(uint *)&pCutC->field_0x4;
    uVar7 = uVar24 >> 1 & 0xffffff;
    pVVar2 = p->vTtMem;
    if (pVVar2->nEntries <= (int)uVar7) goto LAB_003f9084;
    local_40 = -(ulong)((uVar24 >> 0x19 & 1 ^ fComplC) != (uVar24 & 1)) ^
               pVVar2->ppPages[uVar7 >> ((byte)pVVar2->LogPageSze & 0x1f)]
               [(ulong)(pVVar2->PageMask & uVar7) * (long)pVVar2->nEntrySize];
    iVar4 = p->nLutSize;
    if (0x7ffffff < uVar24 && 0x7ffffff < *(uint *)&pCut->field_0x4) {
      uVar24 = (uVar24 >> 0x1b) - 1;
      uVar23 = (ulong)(*(uint *)&pCut->field_0x4 >> 0x1b);
      do {
        if (pCut->pLeaves[uVar23 - 1] <= pCutC->pLeaves[uVar24]) {
          if (pCutC->pLeaves[uVar24] != pCut->pLeaves[uVar23 - 1]) {
LAB_003f9065:
            __assert_fail("pCut0->pLeaves[k] == pCut->pLeaves[i]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mpm/mpmTruth.c"
                          ,0x36,"void Mpm_TruthStretch(word *, Mpm_Cut_t *, Mpm_Cut_t *, int)");
          }
          uVar7 = (int)uVar23 - 1;
          if (uVar24 < uVar7) {
            Abc_TtSwapVars(&local_40,iVar4,uVar24,uVar7);
          }
          uVar24 = uVar24 - 1;
        }
      } while ((1 < uVar23) && (uVar23 = uVar23 - 1, -1 < (int)uVar24));
      goto LAB_003f865f;
    }
  }
  if (6 < iVar4) {
    __assert_fail("p->nLutSize <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mpm/mpmTruth.c"
                  ,0xa1,
                  "int Mpm_CutComputeTruth6(Mpm_Man_t *, Mpm_Cut_t *, Mpm_Cut_t *, Mpm_Cut_t *, Mpm_Cut_t *, int, int, int, int)"
                 );
  }
  if (Type == 3) {
    local_58 = (local_50 ^ local_48) & local_40 ^ local_48;
  }
  else if (Type == 2) {
    local_58 = local_50 ^ local_48;
  }
  else {
    if (Type != 1) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mpm/mpmTruth.c"
                    ,0xa8,
                    "int Mpm_CutComputeTruth6(Mpm_Man_t *, Mpm_Cut_t *, Mpm_Cut_t *, Mpm_Cut_t *, Mpm_Cut_t *, int, int, int, int)"
                   );
    }
    local_58 = local_50 & local_48;
  }
  if ((local_58 & 1) == 0) {
    uVar24 = Vec_MemHashInsert(p->vTtMem,&local_58);
    if ((int)uVar24 < 0) goto LAB_003f90a3;
    uVar24 = (*(uint *)&pCut->field_0x4 & 0xfe000000) + (uVar24 & 0xffffff) * 2;
  }
  else {
    local_58 = ~local_58;
    uVar24 = Vec_MemHashInsert(p->vTtMem,&local_58);
    if ((int)uVar24 < 0) goto LAB_003f90a3;
    uVar24 = (*(uint *)&pCut->field_0x4 & 0xfe000000) + (uVar24 & 0xffffff) * 2 + 1;
  }
  *(uint *)&pCut->field_0x4 = uVar24;
  if (p->pPars->fCutMin != 0) {
    uVar7 = uVar24 >> 1 & 0xffffff;
    pVVar2 = p->vTtMem;
    if (pVVar2->nEntries <= (int)uVar7) {
LAB_003f9084:
      __assert_fail("i >= 0 && i < p->nEntries",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecMem.h"
                    ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
    }
    local_38 = pVVar2->ppPages[uVar7 >> ((byte)pVVar2->LogPageSze & 0x1f)]
               [(ulong)(pVVar2->PageMask & uVar7) * (long)pVVar2->nEntrySize];
    if (0x37ffffff < uVar24) {
      __assert_fail("nVars <= 6",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                    ,0x436,"int Abc_Tt6SupportAndSize(word, int, int *)");
    }
    uVar7 = 0;
    uVar10 = 0;
    if (0x7ffffff < uVar24) {
      pwVar18 = s_Truths6Neg;
      uVar7 = 0;
      uVar19 = 0;
      uVar23 = 0;
      uVar10 = 0;
      do {
        uVar14 = 1 << ((byte)uVar23 & 0x1f);
        uVar15 = uVar19 + 1;
        uVar3 = uVar19 + 1;
        if ((*pwVar18 & (local_38 >> ((byte)uVar14 & 0x3f) ^ local_38)) == 0) {
          uVar14 = 0;
          uVar15 = uVar7;
          uVar3 = uVar19;
        }
        uVar19 = uVar3;
        uVar7 = uVar15;
        uVar10 = uVar10 | uVar14;
        uVar23 = uVar23 + 1;
        pwVar18 = pwVar18 + 1;
      } while (uVar24 >> 0x1b != uVar23);
    }
    if (uVar7 == uVar24 >> 0x1b) {
      return 0;
    }
    p->nSmallSupp = p->nSmallSupp + (uint)((int)uVar7 < 2);
    uVar24 = *(uint *)&pCut->field_0x4;
    uVar19 = 0;
    if (0x7ffffff < uVar24) {
      uVar23 = 0;
      uVar19 = 0;
      do {
        if ((uVar10 >> ((uint)uVar23 & 0x1f) & 1) != 0) {
          if ((long)(int)uVar19 < (long)uVar23) {
            pCut->pLeaves[(int)uVar19] = pCut->pLeaves[uVar23];
            Abc_TtSwapVars(&local_38,p->nLutSize,uVar19,(uint)uVar23);
            uVar24 = *(uint *)&pCut->field_0x4;
          }
          uVar19 = uVar19 + 1;
        }
        uVar23 = uVar23 + 1;
      } while (uVar23 < uVar24 >> 0x1b);
    }
    if (uVar19 != uVar7) {
      __assert_fail("k == nSuppSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mpm/mpmTruth.c"
                    ,0x5f,"int Mpm_CutTruthMinimize6(Mpm_Man_t *, Mpm_Cut_t *)");
    }
    *(uint *)&pCut->field_0x4 = uVar24 & 0x7ffffff | uVar7 << 0x1b;
    lVar5 = 0;
    pwVar18 = s_Truths6Neg;
    uVar24 = 0;
    do {
      uVar24 = (uVar24 + 1) -
               (uint)(((local_38 >> ((byte)(1 << ((byte)lVar5 & 0x1f)) & 0x3f) ^ local_38) &
                      *pwVar18) == 0);
      lVar5 = lVar5 + 1;
      pwVar18 = pwVar18 + 1;
    } while (lVar5 != 6);
    if (uVar7 != uVar24) {
      __assert_fail("nSuppSize == Abc_TtSupportSize(&t, 6)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mpm/mpmTruth.c"
                    ,0x61,"int Mpm_CutTruthMinimize6(Mpm_Man_t *, Mpm_Cut_t *)");
    }
    uVar24 = Vec_MemHashInsert(p->vTtMem,&local_38);
    if ((int)uVar24 < 0) {
LAB_003f90a3:
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                    ,0x10b,"int Abc_Var2Lit(int, int)");
    }
    *(uint *)&pCut->field_0x4 = (*(uint *)&pCut->field_0x4 & 0xfe000001) + (uVar24 & 0xffffff) * 2;
  }
  return 1;
}

Assistant:

int Mpm_CutComputeTruth( Mpm_Man_t * p, Mpm_Cut_t * pCut, Mpm_Cut_t * pCut0, Mpm_Cut_t * pCut1, Mpm_Cut_t * pCutC, int fCompl0, int fCompl1, int fComplC, int Type )
{
    int RetValue;
    if ( p->nLutSize <= 6 )
        RetValue = Mpm_CutComputeTruth6( p, pCut, pCut0, pCut1, pCutC, fCompl0, fCompl1, fComplC, Type );
    else
        RetValue = Mpm_CutComputeTruth7( p, pCut, pCut0, pCut1, pCutC, fCompl0, fCompl1, fComplC, Type );
#ifdef MPM_TRY_NEW
    {
        extern unsigned Abc_TtCanonicize( word * pTruth, int nVars, char * pCanonPerm );
        char pCanonPerm[16];
        memcpy( p->Truth0, p->Truth, sizeof(word) * p->nTruWords );
        Abc_TtCanonicize( p->Truth0, pCut->nLimit, pCanonPerm );
    }
#endif
    return RetValue;
}